

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::Group_MatchEmptyOrDeleted_Test::TestBody
          (Group_MatchEmptyOrDeleted_Test *this)

{
  ElementsAreMatcher<std::tuple<int,_int,_int>_> matcher;
  bool bVar1;
  char *message;
  undefined8 in_stack_ffffffffffffff54;
  AssertHelper local_98 [3];
  Message local_80;
  GroupSse2Impl local_78;
  uint local_60;
  int local_5c [3];
  testing local_50 [8];
  _Tuple_impl<2UL,_int> local_48;
  char local_44 [12];
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  ctrl_t group [16];
  Group_MatchEmptyOrDeleted_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x7ff058003fe0180;
  local_5c[2] = 0;
  local_5c[1] = 2;
  local_5c[0] = 4;
  testing::ElementsAre<int,int,int>(local_50,local_5c + 2,local_5c + 1,local_5c);
  matcher.matchers_.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl = (int)in_stack_ffffffffffffff54;
  matcher.matchers_.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
  _M_head_impl = (int)((ulong)in_stack_ffffffffffffff54 >> 0x20);
  matcher.matchers_.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
       local_48.super__Head_base<2UL,_int,_false>._M_head_impl;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int,int>>>
            (matcher);
  GroupSse2Impl::GroupSse2Impl(&local_78,(ctrl_t *)&gtest_ar.message_);
  local_60 = (uint)GroupSse2Impl::MatchEmptyOrDeleted(&local_78);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int,int>>>::
  operator()(local_38,local_44,(BitMask<unsigned_int,_16,_0> *)"Group{group}.MatchEmptyOrDeleted()")
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0xcc,message);
    testing::internal::AssertHelper::operator=(local_98,&local_80);
    testing::internal::AssertHelper::~AssertHelper(local_98);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

TEST(Group, MatchEmptyOrDeleted) {
  PHMAP_IF_CONSTEXPR (Group::kWidth == 16) {
    ctrl_t group[] = {kEmpty, 1, kDeleted, 3, kEmpty, 5, kSentinel, 7,
                      7,      5, 3,        1, 1,      1, 1,         1};
    EXPECT_THAT(Group{group}.MatchEmptyOrDeleted(), ElementsAre(0, 2, 4));
  } else PHMAP_IF_CONSTEXPR (Group::kWidth == 8) {
    ctrl_t group[] = {kEmpty, 1, 2, kDeleted, 2, 1, kSentinel, 1};
    EXPECT_THAT(Group{group}.MatchEmptyOrDeleted(), ElementsAre(0, 3));
  } else {
    FAIL() << "No test coverage for Group::kWidth==" << Group::kWidth;
  }